

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::repeat(text *opt,text *arg)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  text local_40;
  int local_1c;
  text *ptStack_18;
  int num;
  text *arg_local;
  text *opt_local;
  
  ptStack_18 = arg;
  arg_local = opt;
  std::__cxx11::string::string((string *)&local_40,(string *)arg);
  iVar1 = stoi(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_1c = iVar1;
  iVar1 = indefinite(iVar1);
  if ((iVar1 == 0) && (local_1c < 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"expecting \'-1\' or positive number with option \'",opt);
    std::operator+(&local_a0,&local_c0,"\', got \'");
    std::operator+(&local_80,&local_a0,arg);
    std::operator+(&local_60,&local_80,"\' (try option --help)");
    std::runtime_error::runtime_error(this,(string *)&local_60);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_1c;
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}